

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              secp256k1_sha256 *s2c_sha,secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *s2c_data32,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  void *data_size;
  int local_204;
  secp256k1_scalar *local_200;
  secp256k1_context *local_1f8;
  uint *local_1f0;
  uint local_1e4;
  secp256k1_scalar *local_1e0;
  secp256k1_sha256 *local_1d8;
  secp256k1_nonce_function local_1d0;
  uchar tweak [32];
  uchar local_1a8 [32];
  secp256k1_scalar local_188;
  secp256k1_scalar local_168;
  secp256k1_ge nonce_p;
  secp256k1_gej nonce_pj;
  secp256k1_scalar local_70;
  secp256k1_scalar local_50;
  
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  local_1d0 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    local_1d0 = noncefp;
  }
  local_200 = r;
  local_1f8 = ctx;
  local_1f0 = (uint *)recid;
  local_1d8 = s2c_sha;
  local_1e4 = secp256k1_scalar_set_b32_seckey(&local_168,seckey);
  secp256k1_scalar_cmov(&local_168,&secp256k1_scalar_one,local_1e4 ^ 1);
  secp256k1_scalar_set_b32(&local_188,msg32,(int *)0x0);
  local_1f8 = (secp256k1_context *)&local_1f8->ecmult_gen_ctx;
  uVar4 = 0;
  local_1e0 = s;
  while( true ) {
    data_size = noncedata;
    iVar1 = (*local_1d0)(local_1a8,msg32,seckey,(uchar *)0x0,noncedata,uVar4);
    if (iVar1 == 0) break;
    iVar1 = secp256k1_scalar_set_b32_seckey(&local_70,local_1a8);
    if (iVar1 != 0) {
      if (s2c_data32 != (uchar *)0x0) {
        secp256k1_ecmult_gen((secp256k1_ecmult_gen_context *)local_1f8,&nonce_pj,&local_70);
        secp256k1_ge_set_gej(&nonce_p,&nonce_pj);
        if (s2c_opening != (secp256k1_ecdsa_s2c_opening *)0x0) {
          secp256k1_pubkey_save((secp256k1_pubkey_conflict *)s2c_opening,&nonce_p);
        }
        iVar1 = secp256k1_ec_commit_tweak(tweak,&nonce_p,local_1d8,s2c_data32,(size_t)data_size);
        if (iVar1 == 0) {
          uVar4 = 0;
          s = local_1e0;
          goto LAB_0040f211;
        }
        iVar1 = secp256k1_ec_seckey_tweak_add_helper(&local_70,tweak);
        s = local_1e0;
        if (iVar1 == 0) break;
      }
      local_204 = 0;
      secp256k1_ecmult_gen((secp256k1_ecmult_gen_context *)local_1f8,&nonce_pj,&local_70);
      secp256k1_ge_set_gej(&nonce_p,&nonce_pj);
      secp256k1_fe_normalize(&nonce_p.x);
      secp256k1_fe_normalize(&nonce_p.y);
      secp256k1_fe_get_b32(tweak,&nonce_p.x);
      secp256k1_scalar_set_b32(local_200,tweak,&local_204);
      if (local_1f0 != (uint *)0x0) {
        *local_1f0 = ((uint)nonce_p.y.n[0] & 1) + local_204 * 2;
      }
      secp256k1_scalar_mul(&local_50,local_200,&local_168);
      secp256k1_scalar_add(&local_50,&local_50,&local_188);
      secp256k1_scalar_inverse(s,&local_70);
      secp256k1_scalar_mul(s,s,&local_50);
      secp256k1_gej_clear(&nonce_pj);
      secp256k1_ge_clear(&nonce_p);
      uVar2 = secp256k1_scalar_is_high(s);
      secp256k1_scalar_cond_negate(s,uVar2);
      if (local_1f0 != (uint *)0x0) {
        *local_1f0 = *local_1f0 ^ uVar2;
      }
      iVar1 = secp256k1_scalar_is_zero(local_200);
      iVar3 = secp256k1_scalar_is_zero(s);
      if (iVar3 == 0 && iVar1 == 0) {
        uVar4 = 1;
        goto LAB_0040f211;
      }
    }
    uVar4 = uVar4 + 1;
  }
  uVar4 = 0;
LAB_0040f211:
  uVar4 = uVar4 & local_1e4;
  uVar2 = uVar4 ^ 1;
  secp256k1_scalar_cmov(local_200,&secp256k1_scalar_zero,uVar2);
  secp256k1_scalar_cmov(s,&secp256k1_scalar_zero,uVar2);
  if (local_1f0 != (uint *)0x0) {
    *local_1f0 = uVar2 - 1 & *local_1f0;
  }
  return uVar4;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, secp256k1_sha256* s2c_sha, secp256k1_ecdsa_s2c_opening *s2c_opening, const unsigned char* s2c_data32, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }
    /* sign-to-contract commitments only work with the default nonce function,
     * because we need to ensure that s2c_data is actually hashed into the nonce and
     * not just ignored. Otherwise an attacker can exfiltrate the secret key by
     * signing the same message thrice with different commitments. */
    VERIFY_CHECK(s2c_data32 == NULL || noncefp == secp256k1_nonce_function_default);

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            if (s2c_data32 != NULL) {
                secp256k1_gej nonce_pj;
                secp256k1_ge nonce_p;

                /* Compute original nonce commitment/pubkey */
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_pj, &non);
                secp256k1_ge_set_gej(&nonce_p, &nonce_pj);
                if (s2c_opening != NULL) {
                    secp256k1_ecdsa_s2c_opening_save(s2c_opening, &nonce_p);
                }

                /* Because the nonce is valid, the nonce point isn't the point
                 * at infinity and we can declassify that information to be able to
                 * serialize the point. */
                secp256k1_declassify(ctx, &nonce_p.infinity, sizeof(nonce_p.infinity));

                /* Tweak nonce with s2c commitment. */
                ret = secp256k1_ec_commit_seckey(&non, &nonce_p, s2c_sha, s2c_data32, 32);
                secp256k1_declassify(ctx, &ret, sizeof(ret)); /* may be secret that the tweak falied, but happens with negligible probability */
                if (!ret) {
                    break;
                }
            }

            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}